

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

void __thiscall dap::any::alloc(any *this,size_t size,size_t align)

{
  bool bVar1;
  void *pvVar2;
  size_t align_local;
  size_t size_local;
  any *this_local;
  
  if (this->value != (void *)0x0) {
    __assert_fail("value == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                  ,0xb9,"void dap::any::alloc(size_t, size_t)");
  }
  pvVar2 = alignUp(this->buffer,align);
  this->value = pvVar2;
  bVar1 = isInBuffer(this,(void *)((long)this->value + (size - 1)));
  if (!bVar1) {
    pvVar2 = operator_new__(size + align);
    this->heap = pvVar2;
    pvVar2 = alignUp(this->heap,align);
    this->value = pvVar2;
  }
  return;
}

Assistant:

void any::alloc(size_t size, size_t align) {
  assert(value == nullptr);
  value = alignUp(buffer, align);
  if (isInBuffer(reinterpret_cast<uint8_t*>(value) + size - 1)) {
    return;
  }
  heap = new uint8_t[size + align];
  value = alignUp(heap, align);
}